

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
::
find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry>
                 table,uint *params)

{
  int iVar1;
  RpcClient *pRVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  uint uVar5;
  Entry *pEVar6;
  ulong uVar7;
  uint *in_R8;
  Maybe<unsigned_long> MVar8;
  
  pEVar6 = table.ptr;
  aVar4.value = table.size_;
  if ((pEVar6->value).promiseFulfiller.ptr.disposer != (Disposer *)0x0) {
    uVar3 = hashCode<unsigned_int&>(in_R8);
    pRVar2 = (pEVar6->value).appClient.ptr;
    aVar4 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            (pEVar6->value).promiseFulfiller.ptr.disposer;
    uVar5 = (int)aVar4.value - 1U & uVar3;
    while( true ) {
      uVar7 = (ulong)uVar5;
      iVar1 = *(int *)((long)&(pRVar2->super_ClientHook)._vptr_ClientHook + uVar7 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) &&
          (*(uint *)(&(pRVar2->super_ClientHook)._vptr_ClientHook + uVar7) == uVar3)) &&
         (*(uint *)(table.size_ + (ulong)(iVar1 - 2) * 0x28) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_002c5393;
      }
      uVar5 = (uint)(uVar7 + 1);
      if (uVar7 + 1 == aVar4.value) {
        uVar5 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
           )0x0;
LAB_002c5393:
  MVar8.ptr.field_1.value = aVar4.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }